

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cpp
# Opt level: O2

void __thiscall log::openFile(log *this,string *name)

{
  char cVar1;
  ofstream *this_00;
  
  this_00 = (ofstream *)operator_new(0x200);
  std::ofstream::ofstream(this_00,(string *)name,_S_out);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    std::ofstream::close();
    this->_file = (ofstream *)this_00;
  }
  return;
}

Assistant:

void log::openFile(std::string &name) {
    std::ofstream *tmp = new std::ofstream(name);
    if (tmp->is_open()){
        _file->close();
        _file = tmp;
    }
}